

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowAggFinal(WindowCodeArg *p,int bFin)

{
  Vdbe *pVVar1;
  Vdbe *p_00;
  int in_ESI;
  long in_RDI;
  int nArg;
  Window *pWin;
  Vdbe *v;
  Window *pMWin;
  Parse *pParse;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Vdbe *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Vdbe *p_01;
  
  pVVar1 = *(Vdbe **)(in_RDI + 8);
  p_00 = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  for (p_01 = pVVar1; p_01 != (Vdbe *)0x0; p_01 = *(Vdbe **)&p_01->iStatement) {
    if (((*(int *)((long)&pVVar1->aVar + 4) == 0) &&
        ((((FuncDef *)p_01->nFkConstraint)->funcFlags & 0x1000) != 0)) &&
       (*(u8 *)((long)&p_01->nVar + 1) != '[')) {
      sqlite3VdbeAddOp2(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                        in_stack_ffffffffffffffb8,0);
      sqlite3VdbeAddOp1(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                        in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc0 = p_00;
      sqlite3VdbeAddOp3(p_00,(int)((ulong)p_01 >> 0x20),(int)p_01,in_stack_ffffffffffffffcc,
                        in_stack_ffffffffffffffc8);
      p_00 = in_stack_ffffffffffffffc0;
      sqlite3VdbeCurrentAddr(in_stack_ffffffffffffffc0);
      sqlite3VdbeJumpHere(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    else if (*(int *)&p_01->aMem == 0) {
      in_stack_ffffffffffffffcc = windowArgCount((Window *)p_01);
      if (in_ESI == 0) {
        sqlite3VdbeAddOp3(p_00,(int)((ulong)p_01 >> 0x20),(int)p_01,in_stack_ffffffffffffffcc,
                          in_stack_ffffffffffffffc8);
        sqlite3VdbeAppendP4(p_01,(void *)CONCAT44(in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8),
                            (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      }
      else {
        sqlite3VdbeAddOp2(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb8,0);
        sqlite3VdbeAppendP4(p_01,(void *)CONCAT44(in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8),
                            (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
        sqlite3VdbeAddOp2(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb8,0);
        sqlite3VdbeAddOp2(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          in_stack_ffffffffffffffb8,0);
      }
    }
  }
  return;
}

Assistant:

static void windowAggFinal(WindowCodeArg *p, int bFin){
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    if( pMWin->regStartRowid==0
     && (pWin->pWFunc->funcFlags & SQLITE_FUNC_MINMAX)
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
      sqlite3VdbeAddOp1(v, OP_Last, pWin->csrApp);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, pWin->csrApp, 0, pWin->regResult);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
    }else if( pWin->regApp ){
      assert( pMWin->regStartRowid==0 );
    }else{
      int nArg = windowArgCount(pWin);
      if( bFin ){
        sqlite3VdbeAddOp2(v, OP_AggFinal, pWin->regAccum, nArg);
        sqlite3VdbeAppendP4(v, pWin->pWFunc, P4_FUNCDEF);
        sqlite3VdbeAddOp2(v, OP_Copy, pWin->regAccum, pWin->regResult);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
      }else{
        sqlite3VdbeAddOp3(v, OP_AggValue,pWin->regAccum,nArg,pWin->regResult);
        sqlite3VdbeAppendP4(v, pWin->pWFunc, P4_FUNCDEF);
      }
    }
  }
}